

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcmd.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  initializer_list<char> short_names;
  bool bVar1;
  element_type eVar2;
  element_type eVar3;
  ostream *poVar4;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
  *command;
  argument_order order;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cc8;
  error *e;
  element_type addOpts;
  element_type name;
  element_type helloOpts;
  string_type local_bb8;
  undefined1 local_b98 [8];
  type opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  allocator local_b39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  undefined1 local_b12;
  allocator local_b11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  iterator local_ae8;
  size_type local_ae0;
  char local_ad1 [9];
  size_type local_ac8;
  allocator local_ab9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  allocator local_a91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  allocator local_a69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  allocator local_a41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  allocator local_9f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_9d8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
  local_990;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
  local_878;
  undefined1 local_658 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
  cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  allocator local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  allocator local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_300;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>_>_>
  local_2b8;
  undefined1 local_230 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>
  addCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_e8;
  undefined1 local_a0 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  helloCmd;
  char **argv_local;
  int argc_local;
  
  helloCmd.m_arguments.
  super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.read._M_invoker = (_Invoker_type)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"subcmd hello",&local_109);
  std::__cxx11::string::string((string *)&local_140);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_e8,&local_108,&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"NAME",
             (allocator *)
             ((long)&addCmd.m_arguments.
                     super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>
                     .
                     super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_false>
                     ._M_head_impl.read._M_invoker + 7));
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  argument<(char)110,std::__cxx11::string>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0,&local_e8,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&addCmd.m_arguments.
                     super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>
                     .
                     super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_false>
                     ._M_head_impl.read._M_invoker + 7));
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_e8);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"subcmd add",&local_321);
  std::__cxx11::string::string((string *)&local_348);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_300,&local_320,&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"LHS",&local_369);
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  argument<(char)108,int>(&local_2b8,&local_300,&local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"RHS",(allocator *)&cmd.field_0x2bf);
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>>>
  ::argument<(char)114,int>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>
              *)local_230,&local_2b8,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&cmd.field_0x2bf);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>_>_>
  ::~basic_command(&local_2b8);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_300);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9f8,"subcmd",&local_9f9);
  std::__cxx11::string::string((string *)&local_a20);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_9d8,&local_9f8,&local_a20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a40,"hello",&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a68,"hello command",&local_a69);
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  subcommand<(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>
            (&local_990,&local_9d8,&local_a40,&local_a68,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a90,"add",&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ab8,"add command",&local_ab9);
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>>,std::tuple<>>
  ::
  subcommand<(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>
            (&local_878,&local_990,&local_a90,&local_ab8,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>
              *)local_230);
  local_ad1[0] = 'h';
  local_ad1._1_8_ = local_ad1;
  local_ac8 = 1;
  local_b12 = 1;
  local_b10 = &local_b08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b08,"help",&local_b11);
  local_b12 = 0;
  local_ae8 = &local_b08;
  local_ae0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b38,"",&local_b39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b60,"produce help message",
             (allocator *)
             ((long)&opts.
                     super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
                     .value.
                     super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  short_names._M_len = local_ac8;
  short_names._M_array = (iterator)local_ad1._1_8_;
  long_names._M_len = local_ae0;
  long_names._M_array = local_ae8;
  sVar5 = local_ae0;
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>
  ::flag<(char)104,void>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
              *)local_658,&local_878,short_names,long_names,&local_b38,&local_b60,exclusive);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.
                     super_option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>
                     .value.
                     super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::~string((string *)&local_b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_b39);
  local_cc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ae8;
  do {
    local_cc8 = local_cc8 + -1;
    std::__cxx11::string::~string((string *)local_cc8);
    order = (argument_order)sVar5;
  } while (local_cc8 != &local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'r',_int>_>_>_>_>,_std::tuple<>_>
  ::~basic_command(&local_878);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
  ::~basic_command(&local_990);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_a41);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_9d8);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
  nonsugar::
  parse<char,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>
            ((type *)local_b98,(nonsugar *)(ulong)(uint)argc,
             (int)helloCmd.m_arguments.
                  super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  ._M_head_impl.read._M_invoker,(char **)local_658,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
              *)0x0,order);
  bVar1 = nonsugar::
          option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
          ::has<(char)104>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
                            *)local_b98);
  if (bVar1) {
    nonsugar::
    usage<nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>
              (&local_bb8,(nonsugar *)local_658,command);
    std::operator<<((ostream *)&std::cout,(string *)&local_bb8);
    std::__cxx11::string::~string((string *)&local_bb8);
  }
  else {
    bVar1 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
            ::has<(char)72>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
                             *)local_b98);
    if (bVar1) {
      nonsugar::
      option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
      ::get<(char)72>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
                       *)(name.field_2._M_local_buf + 8));
      nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>
      ::get<(char)110>((element_type *)
                       &addOpts.super_option_pair<char,__r_,_int>.value.
                        super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>
                        *)(name.field_2._M_local_buf + 8));
      poVar4 = std::operator<<((ostream *)&std::cout,"Hello, ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &addOpts.super_option_pair<char,__r_,_int>.value.
                                       super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
      std::operator<<(poVar4,"!\n");
      std::__cxx11::string::~string
                ((string *)
                 &addOpts.super_option_pair<char,__r_,_int>.value.
                  super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      nonsugar::
      option_map<char,_nonsugar::detail::option_pair<char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&name.field_2 + 8));
    }
    else {
      bVar1 = nonsugar::
              option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
              ::has<(char)65>((option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
                               *)local_b98);
      if (bVar1) {
        nonsugar::
        option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
        ::get<(char)65>((element_type *)&e,
                        (option_map<char,nonsugar::detail::option_pair<char,(char)104,void>,nonsugar::detail::option_pair<char,(char)72,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)110,std::__cxx11::string>>>,nonsugar::detail::option_pair<char,(char)65,nonsugar::option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>>>
                         *)local_b98);
        eVar2 = nonsugar::
                option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>
                ::get<(char)108>((option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>
                                  *)&e);
        eVar3 = nonsugar::
                option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>
                ::get<(char)114>((option_map<char,nonsugar::detail::option_pair<char,(char)108,int>,nonsugar::detail::option_pair<char,(char)114,int>>
                                  *)&e);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,eVar2 + eVar3);
        std::operator<<(poVar4,"\n");
        nonsugar::
        option_map<char,_nonsugar::detail::option_pair<char,_'l',_int>,_nonsugar::detail::option_pair<char,_'r',_int>_>
        ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>
                       *)&e);
      }
    }
  }
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'H',_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::option_pair<char,_'A',_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,_'l',_int>,_nonsugar::detail::option_pair<char,_'r',_int>_>_>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__h_,_void>,_nonsugar::detail::option_pair<char,__H_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::option_pair<char,__A_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__l_,_int>,_nonsugar::detail::option_pair<char,__r_,_int>_>_>_>
                 *)local_b98);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'H',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'r',_int>_>_>_>_>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
                    *)local_658);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'l',_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'r',_int>_>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>
                    *)local_230);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_a0);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
try {
    // Create subcommands.
    auto const helloCmd = command<char>("subcmd hello")
        .argument<'n', std::string>("NAME")
        ;
    auto const addCmd = command<char>("subcmd add")
        .argument<'l', int>("LHS")
        .argument<'r', int>("RHS")
        ;

    // Create the main command.
    auto const cmd = command<char>("subcmd")
        // Add a subcommand.
        .subcommand<'H'>("hello", "hello command", helloCmd)
         // The template argument is the option identifier.
         // The 1st parameter is the subcommand name.
         // The 2nd parameter is the subcommand summary used in usage.
         // The 3rd parameter is the subcommand itself.

        // Add a subcommand.
        .subcommand<'A'>("add", "add command", addCmd)

        .flag<'h'>({'h'}, {"help"}, "", "produce help message", flag_type::exclusive)
         // flag_type::exclusive indicates that the subcommands are ignored when this flag is
         // specified.
        ;

    // Parse the command line.
    auto const opts = parse(argc, argv, cmd);

    if (opts.has<'h'>()) {
        std::cout << usage(cmd);
        return 0;
    }

    // Read the subcommands.
    if (opts.has<'H'>()) {
        // For subcommands, get() returns the option map of the subcommand.
        auto const helloOpts = opts.get<'H'>();
        auto const name = helloOpts.get<'n'>();
        std::cout << "Hello, " << name << "!\n";
    }
    else if (opts.has<'A'>()) {
        auto const addOpts = opts.get<'A'>();
        std::cout << addOpts.get<'l'>() + addOpts.get<'r'>() << "\n";
    }
} catch (error const &e) {
    std::cerr << e.message() << "\n";
}